

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O1

void vkt::texture::anon_unknown_0::clampFloatingPointTexture(PixelBufferAccess *access)

{
  int z;
  int y;
  int x;
  float fVar1;
  float fVar2;
  
  if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[2]) {
    z = 0;
    do {
      if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]) {
        y = 0;
        do {
          if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]) {
            x = 0;
            do {
              fVar1 = tcu::ConstPixelBufferAccess::getPixDepth
                                (&access->super_ConstPixelBufferAccess,x,y,z);
              fVar2 = 1.0;
              if (fVar1 <= 1.0) {
                fVar2 = fVar1;
              }
              tcu::PixelBufferAccess::setPixDepth
                        (access,(float)(~-(uint)(fVar1 < 0.0) & (uint)fVar2),x,y,z);
              x = x + 1;
            } while (x < (access->super_ConstPixelBufferAccess).m_size.m_data[0]);
          }
          y = y + 1;
        } while (y < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
      }
      z = z + 1;
    } while (z < (access->super_ConstPixelBufferAccess).m_size.m_data[2]);
  }
  return;
}

Assistant:

void clampFloatingPointTexture (const tcu::PixelBufferAccess& access)
{
	DE_ASSERT(isFloatingPointDepthFormat(access.getFormat()));

	for (int z = 0; z < access.getDepth(); ++z)
	for (int y = 0; y < access.getHeight(); ++y)
	for (int x = 0; x < access.getWidth(); ++x)
		access.setPixDepth(de::clamp(access.getPixDepth(x, y, z), 0.0f, 1.0f), x, y, z);
}